

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::GUIDTest_test_guid_string_is_hex_Test::
~GUIDTest_test_guid_string_is_hex_Test(GUIDTest_test_guid_string_is_hex_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(GUIDTest, test_guid_string_is_hex)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid;
        std::string string_val = guid.ToString();
        for (int i = 0; i < string_val.size(); i++)
        {
            ASSERT_TRUE(string_val[i] >= '0' && string_val[i] <= '9' ||
                        string_val[i] >= 'A' && string_val[i] <= 'F' ||
                        string_val[i] >= 'a' && string_val[i] <= 'f');
        }
    }
}